

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * step_abi_cxx11_(string *__return_storage_ptr__,field_t *f,pos_t *s,bool *back,bool *explore
                        )

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  int iVar4;
  string *psVar5;
  bool bVar6;
  ostream *this;
  long *plVar7;
  byte bVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  size_type __n;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  value_type_conflict local_bc;
  field_t *local_b8;
  long local_b0;
  string *local_a8;
  pos_t *local_a0;
  undefined1 local_98 [8];
  way_t ways;
  ulong local_70;
  undefined1 local_68 [8];
  way_t wc;
  uint local_48;
  uint local_44;
  uint local_34;
  
  __n = (size_type)R;
  local_bc = 0;
  local_b8 = f;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_68,(long)C,&local_bc,
             (allocator_type *)
             ((long)&wc.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)local_98,__n,(value_type *)local_68,
           (allocator_type *)
           ((long)&wc.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_a8 = __return_storage_ptr__;
  ways.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)explore;
  if (local_68 != (undefined1  [8])0x0) {
    operator_delete((void *)local_68,
                    (long)wc.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)local_68);
  }
  (((pointer)((long)local_98 + (long)s->first * 0x18))->
  super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start[s->second]
       = 1;
  local_70 = 0xffffffff;
  bVar18 = false;
  local_34 = 0xffffffff;
  local_48 = 0xffffffff;
  local_44 = 0xffffffff;
  local_a0 = s;
  do {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)local_68,
             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)local_98);
    if (R < 1) {
      bVar6 = true;
    }
    else {
      uVar16 = 0;
      bVar8 = 0;
      do {
        if (0 < C) {
          local_b0 = uVar16 + 1;
          lVar9 = 1;
          do {
            piVar3 = (((pointer)((long)local_98 + uVar16 * 0x18))->
                     super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                     _M_start;
            iVar15 = piVar3[lVar9 + -1];
            if (iVar15 == 0) {
              iVar1 = *(int *)(*(long *)&(local_b8->
                                         super__Vector_base<std::vector<ECell,_std::allocator<ECell>_>,_std::allocator<std::vector<ECell,_std::allocator<ECell>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start[uVar16].
                                         super__Vector_base<ECell,_std::allocator<ECell>_>._M_impl.
                                         super__Vector_impl_data + -4 + lVar9 * 4);
              if ((0x26 < iVar1 - 0x2eU) ||
                 ((0x4000220001U >> ((ulong)(iVar1 - 0x2eU) & 0x3f) & 1) == 0)) goto LAB_0010248b;
              if ((uVar16 != 0) &&
                 (0 < (((pointer)((long)local_98 + (uVar16 - 1) * 0x18))->
                      super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                      ._M_start[lVar9 + -1])) {
                (((pointer)((long)local_68 + uVar16 * 0x18))->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start[lVar9 + -1] = 1;
                bVar8 = 1;
              }
              if ((local_b0 < R) &&
                 (0 < (((pointer)((long)local_98 + local_b0 * 0x18))->
                      super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
                      ._M_start[lVar9 + -1])) {
                (((pointer)((long)local_68 + uVar16 * 0x18))->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start[lVar9 + -1] = 1;
                bVar8 = 1;
              }
              if ((lVar9 != 1) && (0 < piVar3[lVar9 + -2])) {
                (((pointer)((long)local_68 + uVar16 * 0x18))->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start[lVar9 + -1] = 1;
                bVar8 = 1;
              }
              if ((lVar9 < C) && (0 < piVar3[lVar9])) {
                (((pointer)((long)local_68 + uVar16 * 0x18))->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start[lVar9 + -1] = 1;
                bVar8 = 1;
              }
              if ((((pointer)((long)local_68 + uVar16 * 0x18))->
                  super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                  _M_start[lVar9 + -1] == 1) {
                iVar15 = (int)lVar9;
                if (*back == true) {
                  if (iVar1 == 0x54) {
LAB_00102656:
                    bVar18 = true;
                    local_48 = (uint)uVar16;
                    local_44 = iVar15 - 1;
                  }
                }
                else {
                  if (iVar1 == 0x43) {
                    local_70 = uVar16;
                  }
                  local_70 = local_70 & 0xffffffff;
                  if (iVar1 == 0x43) {
                    local_34 = iVar15 - 1;
                  }
                  if ((iVar1 == 0x3f) &&
                     (*(char *)&((ways.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start != '\0')) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"move to ",8);
                    this = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(uint)uVar16);
                    std::__ostream_insert<char,std::char_traits<char>>(this,", ",2);
                    plVar7 = (long *)std::ostream::operator<<(this,iVar15 + -1);
                    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
                    std::ostream::put((char)plVar7);
                    std::ostream::flush();
                    goto LAB_00102656;
                  }
                }
              }
            }
            else {
LAB_0010248b:
              if (0 < iVar15) {
                (((pointer)((long)local_68 + uVar16 * 0x18))->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start[lVar9 + -1] = iVar15 + 1;
              }
            }
            bVar6 = lVar9 < C;
            lVar9 = lVar9 + 1;
          } while (bVar6);
        }
        uVar16 = uVar16 + 1;
      } while ((long)uVar16 < (long)R);
      bVar6 = (bool)(bVar8 ^ 1);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator=((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_98,
                (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)local_68);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)local_68);
    psVar5 = local_a8;
    if (bVar6 || bVar18) {
      if ((!bVar18) &&
         (*(char *)&((ways.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                    super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                    _M_start == '\x01')) {
        *(undefined1 *)
         &((ways.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage)->
          super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start =
             0;
      }
      bVar18 = ((*back | *(byte *)&((ways.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start) & 1) != 0;
      if (bVar18) {
        local_70 = (ulong)local_48;
      }
      iVar15 = (int)local_70;
      if (bVar18) {
        local_34 = local_44;
      }
      if (0 < R) {
        lVar9 = 0;
        do {
          if (0 < C) {
            lVar17 = 0;
            do {
              *(undefined8 *)(__cxa_finalize + *(long *)(std::cerr + -0x18)) = 3;
              std::ostream::operator<<
                        ((ostream *)&std::cerr,
                         (((pointer)((long)local_98 + lVar9 * 0x18))->
                         super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start[lVar17]);
              lVar17 = lVar17 + 1;
            } while (lVar17 < C);
          }
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18));
          std::ostream::put('\0');
          std::ostream::flush();
          lVar9 = lVar9 + 1;
        } while (lVar9 < R);
      }
      uVar16 = (ulong)local_34;
      if (iVar15 != -1) {
        iVar1 = local_a0->first;
        iVar2 = local_a0->second;
        iVar10 = iVar15 - iVar1;
        iVar4 = -iVar10;
        if (0 < iVar10) {
          iVar4 = iVar10;
        }
        iVar11 = local_34 - iVar2;
        iVar10 = -iVar11;
        if (0 < iVar11) {
          iVar10 = iVar11;
        }
        uVar14 = iVar10 + iVar4;
        do {
          if (uVar14 < 2) {
            if ((uint)(iVar10 + iVar4) < 2) {
              *back = true;
            }
            if (iVar15 < iVar1) {
              (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)psVar5,"UP","");
            }
            else if (iVar1 < iVar15) {
              (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)psVar5,"DOWN","");
            }
            else if ((int)local_34 < iVar2) {
              (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)psVar5,"LEFT","");
            }
            else {
              if ((int)local_34 <= iVar2) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/hard/the.labyrinth/main.cpp"
                              ,0xad,
                              "std::string step(const field_t &, const pos_t &, bool &, bool &)");
              }
              (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)psVar5,"RIGHT","");
            }
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       *)local_98);
            return psVar5;
          }
          iVar11 = (int)uVar16;
          iVar15 = (int)local_70;
          if ((iVar15 < 1) ||
             ((((pointer)((long)local_98 + (long)(int)(iVar15 - 1U) * 0x18))->
              super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start[iVar11] <=
              (((pointer)((long)local_98 + local_70 * 0x18))->
              super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_start[iVar11])) {
            uVar14 = iVar15 + 1;
            if (((int)uVar14 < R) &&
               ((((pointer)((long)local_98 + (long)iVar15 * 0x18))->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start[iVar11] <
                (((pointer)((long)local_98 + (long)(int)uVar14 * 0x18))->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_start[iVar11])) {
              local_70 = (ulong)uVar14;
            }
            else if ((iVar11 < 1) ||
                    (piVar3 = (((pointer)((long)local_98 + (long)iVar15 * 0x18))->
                              super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start,
                    piVar3[(long)iVar11 + -1] <= piVar3[uVar16])) {
              uVar14 = iVar11 + 1;
              uVar16 = (ulong)uVar14;
              if ((C <= (int)uVar14) ||
                 (piVar3 = (((pointer)((long)local_98 + (long)iVar15 * 0x18))->
                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                           super__Vector_impl_data._M_start, piVar3[(int)uVar14] <= piVar3[iVar11]))
              {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/hard/the.labyrinth/main.cpp"
                              ,0x96,
                              "std::string step(const field_t &, const pos_t &, bool &, bool &)");
              }
            }
            else {
              uVar16 = (ulong)(iVar11 - 1);
            }
          }
          else {
            local_70 = (ulong)(iVar15 - 1U);
          }
          local_34 = (uint)uVar16;
          iVar15 = (int)local_70;
          iVar12 = iVar15 - iVar1;
          iVar11 = -iVar12;
          if (0 < iVar12) {
            iVar11 = iVar12;
          }
          iVar13 = local_34 - iVar2;
          iVar12 = -iVar13;
          if (0 < iVar13) {
            iVar12 = iVar13;
          }
          uVar14 = iVar12 + iVar11;
        } while( true );
      }
      __assert_fail("-1 != e.first",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kvirund[P]codingame/hard/the.labyrinth/main.cpp"
                    ,0x7e,"std::string step(const field_t &, const pos_t &, bool &, bool &)");
    }
  } while( true );
}

Assistant:

std::string step(const field_t& f, const pos_t& s, bool& back, bool& explore)
{
    bool step_taken;
    bool found_way = false;
    way_t ways(R, wrow_t(C, 0));
    ways[s.first][s.second] = 1;
    pos_t e(-1, -1);
    pos_t c(-1, -1);
    do
    {
        step_taken = false;
        way_t wc = ways; 
        for (int y = 0; y < R; y++)
        {
            for (int x = 0; x < C; x++)
            {
                if (0 == ways[y][x]
                    && (EC_HOLLOW == f[y][x]
                        || EC_CONTROL == f[y][x]
                        || EC_START == f[y][x]
                        || EC_UNKNOWN == f[y][x]))
                {
                    if (0 < y && 0 < ways[y - 1][x])
                    {
                        wc[y][x] = 1;
                        step_taken = true;
                    }
                    if (R > y + 1 && 0 < ways[y + 1][x])
                    {
                        wc[y][x] = 1;
                        step_taken = true;
                    }
                    if (0 < x && 0 < ways[y][x - 1])
                    {
                        wc[y][x] = 1;
                        step_taken = true;
                    }
                    if (C > x + 1 && 0 < ways[y][x + 1])
                    {
                        wc[y][x] = 1;
                        step_taken = true;
                    }
                    if (1 == wc[y][x])
                    {
                        if (back)
                        {
                            if (EC_START == f[y][x])
                            {
                                found_way = true;
                                e = pos_t(y, x);
                            }
                        }
                        else
                        {
                            if (EC_CONTROL == f[y][x])
                            {
                                c = pos_t(y, x);
                            }
                            if (explore && EC_UNKNOWN == f[y][x])
                            {
                                found_way = true;
                                e = pos_t(y, x);
                                std::cerr << "move to " << y << ", " << x << std::endl;
                            }
                        }
                    }
                } else if (0 < ways[y][x])
                {
                    wc[y][x] = 1 + ways[y][x];
                }
            }
        }
        ways = wc;
    } while (step_taken && !found_way);
    
    if (!found_way && explore)
    {
        explore = false;
    }
    
    if (!explore && !back)
    {
        e = c;
    }
    
    for (int y = 0; y < R; y++)
    {
        for (int x = 0; x < C; x++)
        {
            std::cerr.width(3);
            std::cerr << ways[y][x];
        }
        std::cerr << std::endl;
    }

    assert(-1 != e.first);
    
    bool last_step = true;
    while (1 < abs(e.first - s.first) + abs(e.second - s.second))
    {
        //std::cerr << e.first << ", " << e.second << std::endl;
        if (0 < e.first && ways[e.first][e.second] < ways[e.first - 1][e.second])
        {
            e.first--;
        }
        else if (R > e.first + 1 && ways[e.first][e.second] < ways[e.first + 1][e.second])
        {
            e.first++;
        }
        else if (0 < e.second && ways[e.first][e.second] < ways[e.first][e.second - 1])
        {
            e.second--;
        }
        else if (C > e.second + 1 && ways[e.first][e.second] < ways[e.first][e.second + 1])
        {
            e.second++;
        }
        else
        {
            assert(false);
        }
        last_step = false;
    }
    
    if (last_step)
    {
        back = true;
    }
    if (e.first < s.first)
    {
        return "UP";
    } else if (e.first > s.first)
    {
        return "DOWN";
    } else if (e.second < s.second)
    {
        return "LEFT";
    } else if (e.second > s.second)
    {
        return "RIGHT";
    }
    
    assert(false);
}